

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * slang::ast::recurseDefaultIfaceInst
                   (Compilation *comp,InterfacePortSymbol *port,InstanceSymbol **firstInst,
                   iterator it,iterator end)

{
  pointer ppSVar1;
  int iVar2;
  int iVar3;
  InstanceArraySymbol *pIVar4;
  undefined4 extraout_var;
  int iVar5;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  long lVar6;
  long lVar7;
  uint32_t i;
  uint uVar8;
  ConstantRange range;
  Symbol *symbol;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  ConstantRange local_88;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_80;
  SmallVectorBase<const_slang::ast::Symbol_*> local_70 [2];
  
  if (it._M_current == end._M_current) {
    pIVar4 = (InstanceArraySymbol *)
             InstanceSymbol::createDefault
                       (comp,port->interfaceDef,(HierarchyOverrideNode *)0x0,
                        (ConfigBlockSymbol *)0x0,(ConfigRule *)0x0,(port->super_Symbol).location);
    if (*firstInst == (InstanceSymbol *)0x0) {
      *firstInst = (InstanceSymbol *)pIVar4;
    }
  }
  else {
    local_88 = *it._M_current;
    iVar2 = local_88.left;
    src = (EVP_PKEY_CTX *)((ulong)local_88 >> 0x20);
    iVar5 = local_88.right;
    iVar3 = iVar2 - iVar5;
    if (iVar2 - iVar5 == 0 || iVar2 < iVar5) {
      iVar3 = -(iVar2 - iVar5);
    }
    if ((comp->options).maxInstanceArray < iVar3 + 1U) {
      pIVar4 = InstanceArraySymbol::createEmpty
                         ((InstanceArraySymbol *)comp,
                          (Compilation *)(port->super_Symbol).name._M_len,
                          *(string_view *)&(port->super_Symbol).name._M_str,
                          (SourceLocation)end._M_current);
    }
    else {
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      local_70[0].len = 0;
      local_70[0].cap = 5;
      for (uVar8 = 0; uVar8 < iVar3 + 1U; uVar8 = uVar8 + 1) {
        local_80._M_ptr =
             (pointer)recurseDefaultIfaceInst(comp,port,firstInst,it._M_current + 1,end);
        (((Symbol *)local_80._M_ptr)->name)._M_len = 0;
        (((Symbol *)local_80._M_ptr)->name)._M_str = "";
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_70,(Symbol **)&local_80);
        src = extraout_RDX;
      }
      iVar3 = SmallVectorBase<const_slang::ast::Symbol_*>::copy(local_70,(EVP_PKEY_CTX *)comp,src);
      local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
      pIVar4 = BumpAllocator::
               emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                         (&comp->super_BumpAllocator,comp,&(port->super_Symbol).name,
                          &(port->super_Symbol).location,&local_80,&local_88);
      ppSVar1 = local_70[0].data_;
      lVar6 = local_70[0].len << 3;
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 8) {
        comp = *(Compilation **)((long)ppSVar1 + lVar7);
        Scope::addMember(&pIVar4->super_Scope,(Symbol *)comp);
      }
      SmallVectorBase<const_slang::ast::Symbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)comp);
    }
  }
  return &pIVar4->super_Symbol;
}

Assistant:

static Symbol* recurseDefaultIfaceInst(Compilation& comp, const InterfacePortSymbol& port,
                                       const InstanceSymbol*& firstInst,
                                       std::span<const ConstantRange>::iterator it,
                                       std::span<const ConstantRange>::iterator end) {
    if (it == end) {
        auto& result = InstanceSymbol::createDefault(comp, *port.interfaceDef, nullptr, nullptr,
                                                     nullptr, port.location);

        if (!firstInst)
            firstInst = &result;
        return &result;
    }

    ConstantRange range = *it++;
    if (range.width() > comp.getOptions().maxInstanceArray)
        return &InstanceArraySymbol::createEmpty(comp, port.name, port.location);

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        auto symbol = recurseDefaultIfaceInst(comp, port, firstInst, it, end);
        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, port.name, port.location,
                                                    elements.copy(comp), range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}